

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_objref.cpp
# Opt level: O0

int ON_ComponentIndexAndNumber::CompareComponent
              (ON_ComponentIndexAndNumber *a,ON_ComponentIndexAndNumber *b)

{
  ON_ComponentIndexAndNumber *b_local;
  ON_ComponentIndexAndNumber *a_local;
  
  if (a == b) {
    a_local._4_4_ = 0;
  }
  else if (a == (ON_ComponentIndexAndNumber *)0x0) {
    a_local._4_4_ = -1;
  }
  else if (b == (ON_ComponentIndexAndNumber *)0x0) {
    a_local._4_4_ = -1;
  }
  else {
    a_local._4_4_ = ON_COMPONENT_INDEX::Compare(&a->m_ci,&b->m_ci);
  }
  return a_local._4_4_;
}

Assistant:

int ON_ComponentIndexAndNumber::CompareComponent(
  const ON_ComponentIndexAndNumber* a,
  const ON_ComponentIndexAndNumber* b
)
{
  if (a == b)
    return 0;
  if (nullptr == a)
    return -1; // nulls sort last
  if (nullptr == b)
    return -1; // nulls sort last
  return ON_COMPONENT_INDEX::Compare(&a->m_ci, &b->m_ci);
}